

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

UdpFieldBaseSyntax * __thiscall
slang::parsing::Parser::parseUdpField
          (Parser *this,bool required,bool isInput,bool isSequential,bool *sawTransition)

{
  undefined1 auVar1 [16];
  bool bVar2;
  byte bVar3;
  UdpEdgeFieldSyntax *this_00;
  Info *pIVar4;
  long lVar5;
  SourceLocation SVar6;
  Diagnostic *pDVar7;
  int iVar8;
  DiagCode code;
  ulong uVar9;
  long lVar10;
  size_t i;
  size_t sVar11;
  Token TVar12;
  Token closeParen;
  string_view sVar13;
  string_view sVar14;
  SourceRange SVar15;
  optional<slang::SourceLocation> loc;
  Token openParen;
  bool isInput_local;
  char chars [2];
  bool error_1;
  bool isSequential_local;
  Parser *local_f0;
  UdpEdgeFieldSyntax *local_e8;
  Info *local_e0;
  bool error;
  undefined1 auStack_d7 [15];
  Token next;
  Token second;
  anon_class_24_3_e8089fb6 nextSymbol;
  Token tok;
  anon_class_32_4_e325f0aa checkTransition;
  
  nextSymbol.isInput = &isInput_local;
  checkTransition.isSequential = &isSequential_local;
  nextSymbol.checkTransition = &checkTransition;
  uVar9 = 0x11;
  isInput_local = isInput;
  isSequential_local = isSequential;
  nextSymbol.this = this;
  checkTransition.isInput = nextSymbol.isInput;
  checkTransition.sawTransition = sawTransition;
  checkTransition.this = this;
  bVar2 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  if (bVar2) {
    loc.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceLocation>._8_8_ = 0;
    loc.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceLocation>._M_payload =
         (_Storage<slang::SourceLocation,_true>)uVar9;
    parseUdpField::anon_class_32_4_e325f0aa::operator()(&checkTransition,loc);
    TVar12 = ParserBase::consume(&this->super_ParserBase);
    local_e0 = TVar12.info;
    local_f0 = TVar12._0_8_;
    error_1 = false;
    TVar12 = parseUdpField::anon_class_24_3_e8089fb6::operator()(&nextSymbol,true,true,&error_1);
    _error = TVar12;
    second = parseUdpField::anon_class_24_3_e8089fb6::operator()(&nextSymbol,false,true,&error_1);
    closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    openParen.info = local_e0;
    openParen._0_8_ = local_f0;
    this_00 = slang::syntax::SyntaxFactory::udpEdgeField
                        (&this->factory,openParen,TVar12,second,closeParen);
    if ((closeParen._0_4_ >> 0x10 & 1) == 0) {
      if (isInput_local == false) {
        SVar15 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
        code.subsystem = Parser;
        code.code = 0xb3;
      }
      else {
        if (error_1 != false) {
          return &this_00->super_UdpFieldBaseSyntax;
        }
        local_e8 = this_00;
        sVar13 = Token::rawText((Token *)&error);
        sVar14 = Token::rawText(&second);
        this_00 = local_e8;
        if (sVar14._M_len + sVar13._M_len == 2) {
          chars[0] = '\0';
          chars[1] = '\0';
          next = _error;
          iVar8 = 0;
          pIVar4 = (Info *)0x0;
          local_f0 = this;
          while (pIVar4 != (Info *)0x20) {
            tok._0_8_ = *(undefined8 *)((long)&pIVar4->rawTextPtr + (long)&next.kind);
            tok.info = *(Info **)((long)&next.info + (long)pIVar4);
            local_e0 = pIVar4;
            sVar13 = Token::rawText(&tok);
            lVar10 = 0;
            for (sVar11 = 0; sVar13._M_len != sVar11; sVar11 = sVar11 + 1) {
              bVar3 = charToLower(sVar13._M_str[sVar11]);
              if (((bVar3 - 0x3f < 0x3a) &&
                  ((0x200000800000001U >> ((ulong)(bVar3 - 0x3f) & 0x3f) & 1) != 0)) ||
                 (bVar3 - 0x30 < 2)) {
                lVar5 = (long)iVar8;
                iVar8 = iVar8 + 1;
                chars[lVar5] = bVar3;
              }
              else {
                SVar6 = Token::location(&tok);
                pDVar7 = ParserBase::addDiag(&local_f0->super_ParserBase,(DiagCode)0xae0005,
                                             (SourceLocation)((long)SVar6 + lVar10));
                Diagnostic::operator<<(pDVar7,bVar3);
              }
              lVar10 = lVar10 + 0x10000000;
            }
            pIVar4 = local_e0 + 1;
          }
          if (iVar8 != 2) {
            return &local_e8->super_UdpFieldBaseSyntax;
          }
          if (chars[0] != chars[1]) {
            return &local_e8->super_UdpFieldBaseSyntax;
          }
          if (chars[0] == '?') {
            return &local_e8->super_UdpFieldBaseSyntax;
          }
          if (chars[0] == 'b') {
            return &local_e8->super_UdpFieldBaseSyntax;
          }
          SVar15 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_e8);
          ParserBase::addDiag(&local_f0->super_ParserBase,(DiagCode)0xb60005,SVar15);
          return &local_e8->super_UdpFieldBaseSyntax;
        }
        SVar15 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_e8);
        code.subsystem = Parser;
        code.code = 0xb7;
      }
      ParserBase::addDiag(&this->super_ParserBase,code,SVar15);
    }
  }
  else {
    auVar1[0xf] = 0;
    auVar1._0_15_ = auStack_d7;
    _error = (Token)(auVar1 << 8);
    next = parseUdpField::anon_class_24_3_e8089fb6::operator()(&nextSymbol,required,false,&error);
    if (next.info == (Info *)0x0) {
      this_00 = (UdpEdgeFieldSyntax *)0x0;
    }
    else {
      if ((isInput_local == false) && (error == false)) {
        sVar13 = Token::rawText(&next);
        if (sVar13._M_len < 2) {
          if (sVar13._M_len != 0) {
            bVar3 = charToLower(*sVar13._M_str);
            if (((bVar3 - 0x66 < 0xd) && ((0x1501U >> (bVar3 - 0x66 & 0x1f) & 1) != 0)) ||
               (bVar3 == 0x2a)) {
              SVar6 = Token::location(&next);
              pDVar7 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xaf0005,SVar6);
              Diagnostic::operator<<(pDVar7,bVar3);
            }
          }
        }
        else {
          SVar15 = Token::range(&next);
          ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb50005,SVar15);
        }
      }
      this_00 = (UdpEdgeFieldSyntax *)
                slang::syntax::SyntaxFactory::udpSimpleField(&this->factory,next);
    }
  }
  return &this_00->super_UdpFieldBaseSyntax;
}

Assistant:

UdpFieldBaseSyntax* Parser::parseUdpField(bool required, bool isInput, bool isSequential,
                                          bool& sawTransition) {
    auto checkTransition = [&](std::optional<SourceLocation> loc = {}) {
        if (isInput) {
            if (sawTransition) {
                if (!loc)
                    loc = peek().location();
                addDiag(diag::UdpDupTransition, *loc);
            }
            else if (!isSequential) {
                if (!loc)
                    loc = peek().location();
                addDiag(diag::UdpEdgeInComb, *loc);
            }
        }
        sawTransition = true;
    };

    auto nextSymbol = [&](bool required, bool insideTrans, bool& error) {
        switch (peek().kind) {
            case TokenKind::Question:
                return consume();
            case TokenKind::Star:
                if (!insideTrans)
                    checkTransition();
                return consume();
            case TokenKind::Minus: {
                auto tok = consume();
                if (isInput) {
                    error = true;
                    addDiag(diag::UdpInvalidMinus, tok.location());
                }
                return tok;
            }
            case TokenKind::Identifier:
            case TokenKind::IntegerLiteral: {
                auto tok = consume();
                auto text = tok.rawText();
                for (size_t i = 0; i < text.length(); i++) {
                    char c = charToLower(text[i]);
                    switch (c) {
                        case '0':
                        case '1':
                        case 'x':
                        case 'b':
                            break;
                        case 'r':
                        case 'f':
                        case 'p':
                        case 'n':
                            if (!insideTrans)
                                checkTransition(tok.location() + i);
                            break;
                        default:
                            error = true;
                            addDiag(diag::UdpInvalidSymbol, tok.location() + i) << c;
                            break;
                    }
                }
                return tok;
            }
            default:
                if (required) {
                    error = true;
                    addDiag(diag::ExpectedUdpSymbol, peek().location());
                }
                return Token();
        }
    };

    if (peek(TokenKind::OpenParenthesis)) {
        checkTransition();
        auto openParen = consume();

        bool error = false;
        auto first = nextSymbol(true, true, error);
        auto second = nextSymbol(false, true, error);
        auto closeParen = expect(TokenKind::CloseParenthesis);
        auto result = &factory.udpEdgeField(openParen, first, second, closeParen);

        if (!closeParen.isMissing()) {
            if (!isInput) {
                addDiag(diag::UdpInvalidTransition, result->sourceRange());
            }
            else if (!error) {
                if (first.rawText().size() + second.rawText().size() != 2) {
                    addDiag(diag::UdpTransitionLength, result->sourceRange());
                }
                else {
                    char chars[2] = {};
                    int idx = 0;
                    for (auto tok : {first, second}) {
                        auto text = tok.rawText();
                        for (size_t i = 0; i < text.length(); i++) {
                            char c = charToLower(text[i]);
                            switch (c) {
                                case '0':
                                case '1':
                                case 'x':
                                case 'b':
                                case '?':
                                    chars[idx++] = c;
                                    break;
                                default:
                                    addDiag(diag::UdpInvalidEdgeSymbol, tok.location() + i) << c;
                                    break;
                            }
                        }
                    }

                    if (idx == 2 && chars[0] == chars[1] && chars[0] != 'b' && chars[0] != '?')
                        addDiag(diag::UdpTransSameChar, result->sourceRange());
                }
            }
        }

        return result;
    }

    bool error = false;
    auto next = nextSymbol(required, false, error);
    if (!next)
        return nullptr;

    if (!isInput && !error) {
        auto text = next.rawText();
        if (text.length() > 1) {
            addDiag(diag::UdpSingleChar, next.range());
        }
        else if (!text.empty()) {
            char c = charToLower(text[0]);
            switch (c) {
                case '*':
                case 'r':
                case 'f':
                case 'p':
                case 'n':
                    addDiag(diag::UdpInvalidInputOnly, next.location()) << c;
                    break;
                default:
                    break;
            }
        }
    }

    return &factory.udpSimpleField(next);
}